

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

void __thiscall QToolBoxButton::initStyleOption(QToolBoxButton *this,QStyleOptionToolBox *option)

{
  byte *pbVar1;
  State *pSVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  QToolBox *this_00;
  long lVar6;
  long lVar7;
  long lVar8;
  QIconPrivate *pQVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  QIconPrivate *local_40;
  QString local_38;
  QWidgetData *local_20;
  
  local_20 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if (option != (QStyleOptionToolBox *)0x0) {
    QStyleOption::initFrom(&option->super_QStyleOption,(QWidget *)this);
    if (this->selected == true) {
      pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    bVar10 = QAbstractButton::isDown(&this->super_QAbstractButton);
    if (bVar10) {
      pSVar2 = &(option->super_QStyleOption).state;
      *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                super_QFlagsStorage<QStyle::StateFlag>.i =
           (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
                 super_QFlagsStorage<QStyle::StateFlag>.i | 4;
    }
    QAbstractButton::text(&local_38,&this->super_QAbstractButton);
    pQVar3 = &((option->text).d.d)->super_QArrayData;
    pcVar4 = (option->text).d.ptr;
    (option->text).d.d = local_38.d.d;
    (option->text).d.ptr = local_38.d.ptr;
    qVar5 = (option->text).d.size;
    (option->text).d.size = local_38.d.size;
    local_38.d.d = (Data *)pQVar3;
    local_38.d.ptr = pcVar4;
    local_38.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    QAbstractButton::icon((QAbstractButton *)&local_40);
    pQVar9 = local_40;
    local_40 = (QIconPrivate *)0x0;
    local_38.d.d = (Data *)(option->icon).d;
    (option->icon).d = pQVar9;
    QIcon::~QIcon((QIcon *)&local_38);
    QIcon::~QIcon((QIcon *)&local_40);
    this_00 = *(QToolBox **)(*(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8 + 0x10)
    ;
    lVar6 = *(long *)&(this_00->super_QFrame).super_QWidget.field_0x8;
    lVar7 = *(long *)(lVar6 + 0x280);
    lVar8 = *(long *)(lVar6 + 0x278);
    if (*(long *)(lVar6 + 0x298) == 0) {
      iVar11 = -1;
    }
    else {
      iVar11 = QToolBox::indexOf(this_00,*(QWidget **)(*(long *)(lVar6 + 0x298) + 0x10));
    }
    iVar13 = (int)((ulong)(lVar7 - lVar8) >> 3);
    if (iVar13 == 1) {
      option->position = OnlyOneTab;
      iVar12 = this->indexInPage;
    }
    else {
      iVar12 = this->indexInPage;
      if (iVar12 == 0) {
        option->position = Beginning;
        iVar12 = 0;
      }
      else if (iVar12 == iVar13 + -1) {
        option->position = End;
      }
      else {
        option->position = Middle;
      }
    }
    if (iVar11 == iVar12 + -1) {
      option->selectedPosition = PreviousIsSelected;
    }
    else if (iVar11 == iVar12 + 1) {
      option->selectedPosition = NextIsSelected;
    }
    else {
      option->selectedPosition = NotAdjacent;
    }
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBoxButton::initStyleOption(QStyleOptionToolBox *option) const
{
    if (!option)
        return;
    option->initFrom(this);
    if (selected)
        option->state |= QStyle::State_Selected;
    if (isDown())
        option->state |= QStyle::State_Sunken;
    option->text = text();
    option->icon = icon();

    QToolBox *toolBox = static_cast<QToolBox *>(parentWidget()); // I know I'm in a tool box.
    const int widgetCount = toolBox->count();
    const int currIndex = toolBox->currentIndex();
    if (widgetCount == 1) {
        option->position = QStyleOptionToolBox::OnlyOneTab;
    } else if (indexInPage == 0) {
        option->position = QStyleOptionToolBox::Beginning;
    } else if (indexInPage == widgetCount - 1) {
        option->position = QStyleOptionToolBox::End;
    } else {
        option->position = QStyleOptionToolBox::Middle;
    }
    if (currIndex == indexInPage - 1) {
        option->selectedPosition = QStyleOptionToolBox::PreviousIsSelected;
    } else if (currIndex == indexInPage + 1) {
        option->selectedPosition = QStyleOptionToolBox::NextIsSelected;
    } else {
        option->selectedPosition = QStyleOptionToolBox::NotAdjacent;
    }
}